

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

shared_ptr<duckdb::RowGroupCollection,_true> __thiscall
duckdb::RowGroupCollection::RemoveColumn(RowGroupCollection *this,idx_t col_idx)

{
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var1;
  undefined1 auVar2 [8];
  RowGroupCollection *pRVar3;
  pointer pBVar4;
  RowGroupSegmentTree *this_00;
  RowGroup *segment;
  type removed_column;
  RowGroupSegmentTree *this_01;
  pointer in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::RowGroupCollection,_true> sVar5;
  undefined1 local_71;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_70;
  undefined1 local_68 [8];
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  result_lock;
  atomic<duckdb::RowGroup_*> local_58;
  pointer local_50;
  vector<duckdb::LogicalType,_true> new_types;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&new_types,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(col_idx + 0x28));
  local_50 = in_RDX;
  vector<duckdb::LogicalType,_true>::erase_at(&new_types,(idx_t)in_RDX);
  local_68 = *(undefined1 (*) [8])(col_idx + 0x10);
  result_lock.
  super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TableStatisticsLock_*,_std::default_delete<duckdb::TableStatisticsLock>_>
  .super__Head_base<0UL,_duckdb::TableStatisticsLock_*,_false>._M_head_impl =
       (unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>)
       (__uniq_ptr_data<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true,_true>
        )0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::RowGroupCollection,std::allocator<duckdb::RowGroupCollection>,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::BlockManager&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,unsigned_long,unsigned_long_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (RowGroupCollection **)&result_lock,(allocator<duckdb::RowGroupCollection> *)&local_71,
             (shared_ptr<duckdb::DataTableInfo,_true> *)(col_idx + 0x18),*(BlockManager **)col_idx,
             &new_types,(unsigned_long *)(col_idx + 0x40),(unsigned_long *)local_68,
             (unsigned_long *)(col_idx + 8));
  this->block_manager =
       (BlockManager *)
       result_lock.
       super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TableStatisticsLock_*,_std::default_delete<duckdb::TableStatisticsLock>_>
       .super__Head_base<0UL,_duckdb::TableStatisticsLock_*,_false>._M_head_impl;
  this->row_group_size = (idx_t)local_58._M_b._M_p;
  if (local_58._M_b._M_p != (__pointer_type)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((atomic<unsigned_long> *)((long)local_58._M_b._M_p + 8))->
               super___atomic_base<unsigned_long>)._M_i =
           (int)(((atomic<unsigned_long> *)((long)local_58._M_b._M_p + 8))->
                super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if (local_58._M_b._M_p == (__pointer_type)0x0) goto LAB_00617cc1;
    }
    else {
      *(int *)&(((atomic<unsigned_long> *)((long)local_58._M_b._M_p + 8))->
               super___atomic_base<unsigned_long>)._M_i =
           (int)(((atomic<unsigned_long> *)((long)local_58._M_b._M_p + 8))->
                super___atomic_base<unsigned_long>)._M_i + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_b._M_p);
  }
LAB_00617cc1:
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::InitializeRemoveColumn
            (&pRVar3->stats,(TableStatistics *)(col_idx + 0x58),(idx_t)local_50);
  shared_ptr<duckdb::RowGroupCollection,_true>::operator->
            ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::GetLock((TableStatistics *)&result_lock);
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*(&result_lock);
  if ((pRVar3->stats).table_sample.
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl != (BlockingSample *)0x0)
  {
    pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->(&(pRVar3->stats).table_sample);
    (*pBVar4->_vptr_BlockingSample[5])(pBVar4);
  }
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                      ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)(col_idx + 0x48));
  segment = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                      (&this_00->super_SegmentTree<duckdb::RowGroup,_true>);
  for (; segment != (RowGroup *)0x0;
      segment = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,segment)) {
    removed_column =
         shared_ptr<duckdb::RowGroupCollection,_true>::operator*
                   ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    RowGroup::RemoveColumn((RowGroup *)local_68,(RowGroupCollection *)segment,(idx_t)removed_column)
    ;
    pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                       ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    this_01 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&pRVar3->row_groups);
    local_70._M_head_impl = (RowGroup *)local_68;
    local_68 = (undefined1  [8])0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&this_01->super_SegmentTree<duckdb::RowGroup,_true>,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_70);
    _Var1._M_head_impl = local_70._M_head_impl;
    if (local_70._M_head_impl != (RowGroup *)0x0) {
      RowGroup::~RowGroup(local_70._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
    auVar2 = local_68;
    local_70._M_head_impl = (RowGroup *)0x0;
    if (local_68 != (undefined1  [8])0x0) {
      RowGroup::~RowGroup((RowGroup *)local_68);
      operator_delete((void *)auVar2);
    }
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&result_lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&new_types);
  sVar5.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::RowGroupCollection,_true>)
         sVar5.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowGroupCollection> RowGroupCollection::RemoveColumn(idx_t col_idx) {
	D_ASSERT(col_idx < types.size());
	auto new_types = types;
	new_types.erase_at(col_idx);

	auto result = make_shared_ptr<RowGroupCollection>(info, block_manager, std::move(new_types), row_start,
	                                                  total_rows.load(), row_group_size);
	result->stats.InitializeRemoveColumn(stats, col_idx);

	auto result_lock = result->stats.GetLock();
	result->stats.DestroyTableSample(*result_lock);

	for (auto &current_row_group : row_groups->Segments()) {
		auto new_row_group = current_row_group.RemoveColumn(*result, col_idx);
		result->row_groups->AppendSegment(std::move(new_row_group));
	}
	return result;
}